

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

NodeScalar * __thiscall c4::yml::Tree::valsc(Tree *this,size_t node)

{
  code *pcVar1;
  Location loc;
  bool bVar2;
  error_flags eVar3;
  NodeData *pNVar4;
  NodeScalar *pNVar5;
  csubstr cVar6;
  char *pcStack_20;
  
  pNVar4 = _p(this,node);
  if (((pNVar4->m_type).type & VAL) == NOTYPE) {
    eVar3 = get_error_flags();
    if ((eVar3 & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pNVar5 = (NodeScalar *)(*pcVar1)();
        return pNVar5;
      }
    }
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    pcStack_20 = cVar6.str;
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4bc8) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4bc8) << 0x40,8);
    loc.name.str = pcStack_20;
    loc.name.len = cVar6.len;
    error("check failed: has_val(node)",0x1b,loc);
  }
  pNVar4 = _p(this,node);
  return &pNVar4->m_val;
}

Assistant:

NodeScalar const& valsc     (size_t node) const { RYML_ASSERT(has_val(node)); return _p(node)->m_val; }